

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHaig.c
# Opt level: O0

int Abc_NtkHaigResetReprs(Hop_Man_t *p)

{
  undefined8 *puVar1;
  int iVar2;
  undefined8 *puVar3;
  Hop_Obj_t *pHVar4;
  Hop_Obj_t *pHVar5;
  int local_30;
  int nNormals;
  int nFanouts;
  int nMembers;
  int nClasses;
  int i;
  Hop_Obj_t *pRepr;
  Hop_Obj_t *pObj;
  Hop_Man_t *p_local;
  
  for (nMembers = 0; iVar2 = Vec_PtrSize(p->vObjs), nMembers < iVar2; nMembers = nMembers + 1) {
    puVar3 = (undefined8 *)Vec_PtrEntry(p->vObjs,nMembers);
    puVar1 = (undefined8 *)*puVar3;
    if ((puVar1 != (undefined8 *)0x0) && ((undefined8 *)*puVar1 == puVar3)) {
      *puVar1 = puVar1;
    }
    if ((undefined8 *)*puVar3 == puVar3) {
      *puVar3 = 0;
    }
  }
  for (nMembers = 0; iVar2 = Vec_PtrSize(p->vObjs), nMembers < iVar2; nMembers = nMembers + 1) {
    pHVar4 = (Hop_Obj_t *)Vec_PtrEntry(p->vObjs,nMembers);
    if ((pHVar4->field_0).pData != (void *)0x0) {
      pHVar5 = Hop_ObjRepr(pHVar4);
      (pHVar5->field_0).pData = pHVar5;
      (pHVar4->field_0).pData = pHVar5;
    }
  }
  for (nMembers = 0; iVar2 = Vec_PtrSize(p->vObjs), nMembers < iVar2; nMembers = nMembers + 1) {
    pHVar4 = (Hop_Obj_t *)Vec_PtrEntry(p->vObjs,nMembers);
    if ((pHVar4->field_0).pData != (void *)0x0) {
      pHVar5 = Hop_ObjRepr(pHVar4);
      if (pHVar4->Id < pHVar5->Id) {
        (pHVar5->field_0).pData = pHVar4;
        (pHVar4->field_0).pData = pHVar4;
      }
      else {
        (pHVar4->field_0).pData = pHVar5;
      }
    }
  }
  local_30 = 0;
  nMembers = 0;
  do {
    iVar2 = Vec_PtrSize(p->vObjs);
    if (iVar2 <= nMembers) {
      return local_30;
    }
    pHVar4 = (Hop_Obj_t *)Vec_PtrEntry(p->vObjs,nMembers);
    if ((pHVar4->field_0).pData != (void *)0x0) {
      if (((Hop_Obj_t *)(pHVar4->field_0).pData != pHVar4) &&
         (iVar2 = Hop_ObjRefs(pHVar4), 0 < iVar2)) {
        local_30 = local_30 + 1;
      }
      pHVar5 = Hop_ObjRepr(pHVar4);
      if ((Hop_Obj_t *)(pHVar4->field_0).pData != pHVar5) {
        __assert_fail("pObj->pData == pRepr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcHaig.c"
                      ,0x202,"int Abc_NtkHaigResetReprs(Hop_Man_t *)");
      }
      if (pHVar4->Id < pHVar5->Id) {
        __assert_fail("pRepr->Id <= pObj->Id",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcHaig.c"
                      ,0x203,"int Abc_NtkHaigResetReprs(Hop_Man_t *)");
      }
    }
    nMembers = nMembers + 1;
  } while( true );
}

Assistant:

int Abc_NtkHaigResetReprs( Hop_Man_t * p )
{
    Hop_Obj_t * pObj, * pRepr;
    int i, nClasses, nMembers, nFanouts, nNormals;
    // clear self-classes
    Vec_PtrForEachEntry( Hop_Obj_t *, p->vObjs, pObj, i )
    {
        // fix the strange situation of double-loop
        pRepr = (Hop_Obj_t *)pObj->pData;
        if ( pRepr && pRepr->pData == pObj )
            pRepr->pData = pRepr;
        // remove self-loops
        if ( pObj->pData == pObj )
            pObj->pData = NULL;
    }
    // set representatives
    Vec_PtrForEachEntry( Hop_Obj_t *, p->vObjs, pObj, i )
    {
        if ( pObj->pData == NULL )
            continue;
        // get representative of the node
        pRepr = Hop_ObjRepr( pObj );
        pRepr->pData = pRepr;
        // set the representative
        pObj->pData = pRepr;
    }
    // make each class point to the smallest topological order
    Vec_PtrForEachEntry( Hop_Obj_t *, p->vObjs, pObj, i )
    {
        if ( pObj->pData == NULL )
            continue;
        pRepr = Hop_ObjRepr( pObj );
        if ( pRepr->Id > pObj->Id )
        {
            pRepr->pData = pObj;
            pObj->pData = pObj;
        }
        else
            pObj->pData = pRepr;
    }
    // count classes, members, and fanouts - and verify
    nMembers = nClasses = nFanouts = nNormals = 0;
    Vec_PtrForEachEntry( Hop_Obj_t *, p->vObjs, pObj, i )
    {
        if ( pObj->pData == NULL )
            continue;
        // count members
        nMembers++;
        // count the classes and fanouts
        if ( pObj->pData == pObj )
            nClasses++;
        else if ( Hop_ObjRefs(pObj) > 0 )
            nFanouts++;
        else
            nNormals++;
        // compare representatives
        pRepr = Hop_ObjRepr( pObj );
        assert( pObj->pData == pRepr );
        assert( pRepr->Id <= pObj->Id );
    }
//    printf( "Nodes = %7d.  Member = %7d.  Classes = %6d.  Fanouts = %6d.  Normals = %6d.\n", 
//        Hop_ManNodeNum(p), nMembers, nClasses, nFanouts, nNormals );
    return nFanouts;
}